

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O2

void __thiscall kj::Exception::extendTrace(Exception *this,uint ignoreCount,uint limit)

{
  ulong uVar1;
  kj *this_00;
  uint uVar2;
  ulong uVar3;
  size_t count;
  ArrayPtr<void_*> space;
  ArrayPtr<void_*const> AVar4;
  Array<void_*> newTraceSpace_heap;
  void *newTraceSpace_stack [40];
  
  if (this->isFullTrace == false) {
    uVar1 = 0x20;
    if (limit < 0x20) {
      uVar1 = (ulong)limit;
    }
    count = uVar1 + ignoreCount + 1;
    uVar2 = ignoreCount;
    if (uVar1 + ignoreCount < 0x28) {
      newTraceSpace_heap.ptr = (void **)0x0;
      newTraceSpace_heap.size_ = 0;
      newTraceSpace_heap.disposer = (ArrayDisposer *)0x0;
      this_00 = (kj *)newTraceSpace_stack;
    }
    else {
      this_00 = (kj *)kj::_::HeapArrayDisposer::allocate<void*>(count);
      newTraceSpace_heap.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
      newTraceSpace_heap.ptr = (void **)this_00;
      newTraceSpace_heap.size_ = count;
    }
    space.size_._0_4_ = ignoreCount + 1;
    space.ptr = (void **)count;
    space.size_._4_4_ = 0;
    AVar4 = getStackTrace(this_00,space,uVar2);
    uVar1 = AVar4.size_;
    if (ignoreCount + 2 < uVar1) {
      uVar3 = 0x20 - (ulong)this->traceCount;
      if (uVar1 <= uVar3) {
        uVar3 = uVar1;
      }
      memcpy(this->trace + this->traceCount,AVar4.ptr,uVar3 * 8);
      this->traceCount = this->traceCount + (int)uVar3;
      this->isFullTrace = true;
    }
    Array<void_*>::~Array(&newTraceSpace_heap);
  }
  return;
}

Assistant:

void Exception::extendTrace(uint ignoreCount, uint limit) {
  if (isFullTrace) {
    // Awkward: extendTrace() was called twice without truncating in between. This should probably
    // be an error, but historically we didn't check for this so I'm hesitant to make it an error
    // now. We shouldn't actually extend the trace, though, as our current trace is presumably
    // rooted in main() and it'd be weird to append frames "above" that.
    // TODO(cleanup): Abort here and see what breaks?
    return;
  }

  KJ_STACK_ARRAY(void*, newTraceSpace, kj::min(kj::size(trace), limit) + ignoreCount + 1,
      sizeof(trace)/sizeof(trace[0]) + 8, 128);

  auto newTrace = kj::getStackTrace(newTraceSpace, ignoreCount + 1);
  if (newTrace.size() > ignoreCount + 2) {
    // Remove suffix that won't fit into our static-sized trace.
    newTrace = newTrace.first(kj::min(kj::size(trace) - traceCount, newTrace.size()));

    // Copy the rest into our trace.
    memcpy(trace + traceCount, newTrace.begin(), newTrace.asBytes().size());
    traceCount += newTrace.size();
    isFullTrace = true;
  }
}